

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O1

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
min_function::evaluate
          (min_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  pointer ppVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar7;
  reference pbVar8;
  reference pbVar9;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *rhs;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar10;
  assertion_error *this_00;
  size_t i;
  ulong i_00;
  bool bVar11;
  string local_50;
  
  ppVar1 = (args->
           super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4 !=
      (this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value) {
    this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"assertion \'args.size() == *this->arity()\' failed at  <> :0",""
              );
    assertion_error::assertion_error(this_00,&local_50);
    __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (ppVar1->type_ == value) {
    pbVar10 = (ppVar1->field_1).value_;
    bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(pbVar10);
    if (bVar3) {
      bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::empty(pbVar10);
      if (bVar3) goto LAB_00381212;
      pbVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(pbVar10,0);
      bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number(pbVar7);
      pbVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(pbVar10,0);
      bVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(pbVar7);
      if (bVar3 || bVar4) {
        pbVar8 = (reference)
                 basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(pbVar10);
        bVar11 = pbVar8 >= (reference)0x2;
        if (pbVar8 < (reference)0x2) {
          i = 0;
        }
        else {
          i_00 = 1;
          pbVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(pbVar10,1);
          bVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                            (pbVar7);
          if (bVar3 == bVar5) {
            i = 0;
            do {
              pbVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                                 (pbVar10,i_00);
              bVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                                (pbVar7);
              if (bVar4 != bVar5) break;
              pbVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                                 (pbVar10,i_00);
              rhs = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(pbVar10,i);
              iVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::compare
                                (pbVar7,rhs);
              sVar2 = i_00;
              if (-1 < iVar6) {
                sVar2 = i;
              }
              i = sVar2;
              i_00 = i_00 + 1;
              pbVar8 = (reference)
                       basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                                 (pbVar10);
              bVar11 = i_00 < pbVar8;
              if (!bVar11) goto LAB_003812cb;
              pbVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                                 (pbVar10,i_00);
              bVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                                (pbVar7);
            } while (bVar3 == bVar5);
          }
          else {
            i = 0;
          }
          std::error_code::operator=(ec,invalid_type);
          pbVar8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   ::null_value(context);
        }
LAB_003812cb:
        if (!bVar11) {
          pbVar10 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(pbVar10,i);
          return pbVar10;
        }
        return pbVar8;
      }
    }
  }
  std::error_code::operator=(ec,invalid_type);
LAB_00381212:
  pbVar9 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::null_value(context);
  return pbVar9;
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                if (!args[0].is_value())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                reference arg0 = args[0].value();
                if (!arg0.is_array())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }
                if (arg0.empty())
                {
                    return context.null_value();
                }

                bool is_number = arg0.at(0).is_number();
                bool is_string = arg0.at(0).is_string();
                if (!is_number && !is_string)
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                std::size_t index = 0;
                for (std::size_t i = 1; i < arg0.size(); ++i)
                {
                    if (!(arg0.at(i).is_number() == is_number && arg0.at(i).is_string() == is_string))
                    {
                        ec = jmespath_errc::invalid_type;
                        return context.null_value();
                    }
                    if (arg0.at(i) < arg0.at(index))
                    {
                        index = i;
                    }
                }

                return arg0.at(index);
            }